

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O2

void __thiscall
sf::RenderTarget::draw
          (RenderTarget *this,Vertex *vertices,size_t vertexCount,PrimitiveType type,
          RenderStates *states)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *expression;
  Vector2f *pVVar4;
  uint uVar5;
  char *this_00;
  Vertex *right;
  size_t sVar6;
  Vector2f VVar7;
  
  if (vertexCount == 0 || vertices == (Vertex *)0x0) {
    return;
  }
  bVar2 = anon_unknown.dwarf_da44d::isActive(this->m_id);
  if ((!bVar2) && (iVar3 = (*this->_vptr_RenderTarget[3])(this,1), (char)iVar3 == '\0')) {
    return;
  }
  if (vertexCount < 5) {
    pVVar4 = (Vector2f *)&(this->m_cache).field_0x38;
    right = vertices;
    sVar6 = vertexCount;
    while (bVar2 = sVar6 != 0, sVar6 = sVar6 - 1, bVar2) {
      VVar7 = operator*(&states->transform,&right->position);
      *(Vector2f *)&pVVar4[-2].y = VVar7;
      pVVar4[-1].y = (float)right->color;
      *pVVar4 = right->texCoords;
      pVVar4 = (Vector2f *)&pVVar4[2].y;
      right = right + 1;
    }
  }
  this_00 = (char *)this;
  setupDraw(this,vertexCount < 5,states);
  bVar2 = states->shader != (Shader *)0x0;
  bVar1 = states->texture != (Texture *)0x0;
  if (((this->m_cache).enable != true) ||
     ((this->m_cache).texCoordsArrayEnabled != (bVar2 || bVar1))) {
    if (bVar2 || bVar1) {
      glEnableClientState();
      expression = "glEnableClientState(GL_TEXTURE_COORD_ARRAY)";
      uVar5 = 0x11e;
    }
    else {
      glDisableClientState(0x8078);
      expression = "glDisableClientState(GL_TEXTURE_COORD_ARRAY)";
      uVar5 = 0x120;
    }
    this_00 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
    ;
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                       ,uVar5,expression);
  }
  if (((vertexCount < 5) && ((this->m_cache).enable != false)) &&
     ((this->m_cache).useVertexCache != false)) {
    if ((!bVar2 && !bVar1) || ((this->m_cache).texCoordsArrayEnabled != false)) goto LAB_00130566;
    pVVar4 = (Vector2f *)&(this->m_cache).field_0x38;
    uVar5 = 0x137;
  }
  else {
    if (vertexCount < 5) {
      vertices = (Vertex *)&(this->m_cache).field_0x2c;
    }
    glVertexPointer(2,0x1406,0x14,vertices);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                       ,0x12d,"glVertexPointer(2, GL_FLOAT, sizeof(Vertex), data + 0)");
    glColorPointer(4,0x1401,0x14,&vertices->color);
    this_00 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
    ;
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                       ,0x12e,"glColorPointer(4, GL_UNSIGNED_BYTE, sizeof(Vertex), data + 8)");
    if (!bVar2 && !bVar1) goto LAB_00130566;
    pVVar4 = &vertices->texCoords;
    uVar5 = 0x130;
  }
  glTexCoordPointer(2,0x1406,0x14,pVVar4);
  this_00 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
  ;
  priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                     ,uVar5,"glTexCoordPointer(2, GL_FLOAT, sizeof(Vertex), data + 12)");
LAB_00130566:
  drawPrimitives((RenderTarget *)this_00,type,0,vertexCount);
  cleanupDraw(this,states);
  (this->m_cache).useVertexCache = vertexCount < 5;
  (this->m_cache).texCoordsArrayEnabled = bVar2 || bVar1;
  return;
}

Assistant:

void RenderTarget::draw(const Vertex* vertices, std::size_t vertexCount,
                        PrimitiveType type, const RenderStates& states)
{
    // Nothing to draw?
    if (!vertices || (vertexCount == 0))
        return;

    // GL_QUADS is unavailable on OpenGL ES
    #ifdef SFML_OPENGL_ES
        if (type == Quads)
        {
            err() << "sf::Quads primitive type is not supported on OpenGL ES platforms, drawing skipped" << std::endl;
            return;
        }
    #endif

    if (isActive(m_id) || setActive(true))
    {
        // Check if the vertex count is low enough so that we can pre-transform them
        bool useVertexCache = (vertexCount <= StatesCache::VertexCacheSize);

        if (useVertexCache)
        {
            // Pre-transform the vertices and store them into the vertex cache
            for (std::size_t i = 0; i < vertexCount; ++i)
            {
                Vertex& vertex = m_cache.vertexCache[i];
                vertex.position = states.transform * vertices[i].position;
                vertex.color = vertices[i].color;
                vertex.texCoords = vertices[i].texCoords;
            }
        }

        setupDraw(useVertexCache, states);

        // Check if texture coordinates array is needed, and update client state accordingly
        bool enableTexCoordsArray = (states.texture || states.shader);
        if (!m_cache.enable || (enableTexCoordsArray != m_cache.texCoordsArrayEnabled))
        {
            if (enableTexCoordsArray)
                glCheck(glEnableClientState(GL_TEXTURE_COORD_ARRAY));
            else
                glCheck(glDisableClientState(GL_TEXTURE_COORD_ARRAY));
        }

        // If we switch between non-cache and cache mode or enable texture
        // coordinates we need to set up the pointers to the vertices' components
        if (!m_cache.enable || !useVertexCache || !m_cache.useVertexCache)
        {
            const char* data = reinterpret_cast<const char*>(vertices);

            // If we pre-transform the vertices, we must use our internal vertex cache
            if (useVertexCache)
                data = reinterpret_cast<const char*>(m_cache.vertexCache);

            glCheck(glVertexPointer(2, GL_FLOAT, sizeof(Vertex), data + 0));
            glCheck(glColorPointer(4, GL_UNSIGNED_BYTE, sizeof(Vertex), data + 8));
            if (enableTexCoordsArray)
                glCheck(glTexCoordPointer(2, GL_FLOAT, sizeof(Vertex), data + 12));
        }
        else if (enableTexCoordsArray && !m_cache.texCoordsArrayEnabled)
        {
            // If we enter this block, we are already using our internal vertex cache
            const char* data = reinterpret_cast<const char*>(m_cache.vertexCache);

            glCheck(glTexCoordPointer(2, GL_FLOAT, sizeof(Vertex), data + 12));
        }

        drawPrimitives(type, 0, vertexCount);
        cleanupDraw(states);

        // Update the cache
        m_cache.useVertexCache = useVertexCache;
        m_cache.texCoordsArrayEnabled = enableTexCoordsArray;
    }
}